

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::AcesOutputFile::AcesOutputFile
          (AcesOutputFile *this,string *name,int width,int height,RgbaChannels rgbaChannels,
          float pixelAspectRatio,V2f *screenWindowCenter,float screenWindowWidth,LineOrder lineOrder
          ,Compression compression,int numThreads)

{
  Data *this_00;
  RgbaOutputFile *this_01;
  Header newHeader;
  
  this->_vptr_AcesOutputFile = (_func_int **)&PTR__AcesOutputFile_00421868;
  this_00 = (Data *)operator_new(8);
  Data::Data(this_00);
  this->_data = this_00;
  anon_unknown_14::checkCompression(compression);
  Header::Header(&newHeader,width,height,pixelAspectRatio,screenWindowCenter,screenWindowWidth,
                 lineOrder,compression);
  acesChromaticities();
  addChromaticities(&newHeader,&acesChromaticities::acesChr);
  acesChromaticities();
  addAdoptedNeutral(&newHeader,&acesChromaticities::acesChr.white);
  this_01 = (RgbaOutputFile *)operator_new(0x18);
  RgbaOutputFile::RgbaOutputFile
            (this_01,(name->_M_dataplus)._M_p,&newHeader,rgbaChannels,numThreads);
  this->_data->rgbaFile = this_01;
  RgbaOutputFile::setYCRounding(this_01,7,6);
  Header::~Header(&newHeader);
  return;
}

Assistant:

AcesOutputFile::AcesOutputFile
    (const std::string &name,
     int width,
     int height,
     RgbaChannels rgbaChannels,
     float pixelAspectRatio,
     const IMATH_NAMESPACE::V2f screenWindowCenter,
     float screenWindowWidth,
     LineOrder lineOrder,
     Compression compression,
     int numThreads)
:
    _data (new Data)
{
    checkCompression (compression);

    Header newHeader (width,
		      height,
		      pixelAspectRatio,
		      screenWindowCenter,
		      screenWindowWidth,
		      lineOrder,
		      compression);

    addChromaticities (newHeader, acesChromaticities());
    addAdoptedNeutral (newHeader, acesChromaticities().white);

    _data->rgbaFile = new RgbaOutputFile (name.c_str(),
					  newHeader,
					  rgbaChannels,
					  numThreads);

    _data->rgbaFile->setYCRounding (7, 6);
}